

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

void __thiscall hmac_hash::SHA1::update(SHA1 *this,uchar *message,size_t length)

{
  bool bVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  uchar *buffer;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e8;
  const_iterator local_e0;
  uint32_t local_d8 [2];
  uint32_t block_1 [16];
  uint32_t block [16];
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_48;
  const_iterator local_40;
  unsigned_long local_38;
  unsigned_long local_30;
  size_t to_copy;
  size_t offset;
  size_t length_local;
  uchar *message_local;
  SHA1 *this_local;
  
  to_copy = 0;
  offset = length;
  length_local = (size_t)message;
  message_local = (uchar *)this;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->m_buffer);
  if (!bVar1) {
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
    local_38 = 0x40 - sVar2;
    puVar3 = std::min<unsigned_long>(&local_38,&offset);
    local_30 = *puVar3;
    local_48._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->m_buffer);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_40,&local_48);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_buffer,local_40,
               (uchar *)length_local,(uchar *)(length_local + local_30));
    to_copy = local_30 + to_copy;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->m_buffer);
    if (sVar2 == 0x40) {
      buffer = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->m_buffer);
      buffer_to_block(this,buffer,block_1 + 0xe);
      transform(this,block_1 + 0xe);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_buffer);
    }
  }
  for (; to_copy + 0x40 <= offset; to_copy = to_copy + 0x40) {
    buffer_to_block(this,(uint8_t *)(length_local + to_copy),local_d8);
    transform(this,local_d8);
  }
  local_e8._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->m_buffer);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_e0,&local_e8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_buffer,local_e0,
             (uchar *)(length_local + to_copy),(uchar *)(length_local + offset));
  return;
}

Assistant:

void SHA1::update(const unsigned char *message, size_t length) {
        size_t offset = 0;

        // Fill buffer if it has existing bytes
        if (!m_buffer.empty()) {
            size_t to_copy = std::min(BLOCK_SIZE - m_buffer.size(), length);
            m_buffer.insert(m_buffer.end(), message, message + to_copy);
            offset += to_copy;

            if (m_buffer.size() == BLOCK_SIZE) {
                uint32_t block[16];
                buffer_to_block(m_buffer.data(), block);
                transform(block);
                m_buffer.clear();
            }
        }

        // Process full blocks directly from message
        while (offset + BLOCK_SIZE <= length) {
            uint32_t block[16];
            buffer_to_block(message + offset, block);
            transform(block);
            offset += BLOCK_SIZE;
        }

        // Store remaining bytes in buffer
        m_buffer.insert(m_buffer.end(), message + offset, message + length);
    }